

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pizza_cutter.cpp
# Opt level: O0

bool __thiscall pizza_cutter::is_new_part_valid(pizza_cutter *this,pizza_slice new_part)

{
  const_reference pvVar1;
  size_type sVar2;
  const_reference pvVar3;
  int local_30;
  int local_2c;
  int col;
  int row;
  pizza_cutter *this_local;
  int iStack_18;
  pizza_slice new_part_local;
  
  if (-1 < new_part._0_8_) {
    new_part_local.col1 = new_part.col2;
    pvVar1 = std::
             vector<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
             ::operator[](&this->pizza_,0);
    sVar2 = std::vector<pizza_cell,_std::allocator<pizza_cell>_>::size(pvVar1);
    if (((ulong)(long)new_part_local.col1 < sVar2) &&
       (this_local._4_4_ = new_part.row1, -1 < this_local._4_4_)) {
      new_part_local.row1 = new_part.row2;
      sVar2 = std::
              vector<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
              ::size(&this->pizza_);
      if ((ulong)(long)new_part_local.row1 < sVar2) {
        local_2c = this_local._4_4_;
        do {
          if (new_part_local.row1 < local_2c) {
            return true;
          }
          iStack_18 = new_part.col1;
          for (local_30 = iStack_18; local_30 <= new_part_local.col1; local_30 = local_30 + 1) {
            pvVar1 = std::
                     vector<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
                     ::operator[](&this->pizza_,(long)local_2c);
            pvVar3 = std::vector<pizza_cell,_std::allocator<pizza_cell>_>::operator[]
                               (pvVar1,(long)local_30);
            if (pvVar3->owner != -1) {
              return false;
            }
          }
          local_2c = local_2c + 1;
        } while( true );
      }
    }
  }
  return false;
}

Assistant:

bool pizza_cutter::is_new_part_valid(pizza_slice new_part) const noexcept
{
    if (new_part.col1 < 0 || new_part.col2 >= pizza_[0].size() ||
        new_part.row1 < 0 || new_part.row2 >= pizza_.size()) {
        return false;
    }

    for (int row = new_part.row1; row <= new_part.row2; ++row) {
        for (int col = new_part.col1; col <= new_part.col2; ++col) {
            if (pizza_[row][col].owner != -1)
                return false;
        }
    }

    return true;
}